

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O1

void __thiscall
Hpipe::InstructionGraph::make_rewind_data(InstructionGraph *this,InstructionRewind *rewind)

{
  long *plVar1;
  pointer pVVar2;
  pointer pCVar3;
  InstructionWithCode *pIVar4;
  InstructionRewind *pIVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  Instruction *pIVar13;
  undefined4 extraout_var;
  ulong uVar14;
  long lVar15;
  long lVar16;
  Vec<Hpipe::Transition> *n;
  pointer pVVar17;
  Instruction *pIVar18;
  long *plVar19;
  pointer pTVar20;
  bool *pbVar21;
  CodeSeqItem *csi;
  Vec<Hpipe::InstructionRewind::CodeSeqItem> *this_00;
  pointer pCVar22;
  Instruction *unaff_R15;
  Instruction *next_rw;
  bool bVar23;
  uint offset_beg;
  InstructionOK *ok;
  InstructionWithCode *wc;
  InstructionRewind *local_120;
  uint local_114;
  Instruction *local_110;
  uint local_104;
  PC local_100;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_120 = rewind;
  make_rewind_exec(this,(rewind->super_Instruction).mark,rewind);
  if (local_120->exec == (Instruction *)0x0) {
    Context::without_mark(&local_100,&(local_120->super_Instruction).cx);
    std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=(&local_120->ncx,&local_100);
    if (local_100.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_100.second.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.second.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
    ::~_Rb_tree(&local_100.first.paths_to_strings._M_t);
    if (local_100.first.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.first.paths_to_mark.
                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_100.first.paths_to_mark.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.first.paths_to_mark.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_100.first.pos.
        super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
        super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.first.pos.
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_100.first.pos.
                            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            .
                            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.first.pos.
                            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            .
                            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    local_58._M_unused._M_object = &local_110;
    local_110 = (Instruction *)0x0;
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:884:29)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:884:29)>
               ::_M_manager;
    Instruction::apply_rw(local_120->exec,(function<void_(Hpipe::Instruction_*)> *)&local_58,false);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    pIVar13 = local_110;
    if ((local_110 != (Instruction *)0x0) &&
       (uVar7 = Instruction::nb_next_rw(local_110), uVar7 < (pIVar13 != local_110) + 1)) {
      uVar7 = 0;
      pIVar18 = (Instruction *)0x0;
      do {
        unaff_R15 = pIVar13;
        local_100.first.pos.
        super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
        super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)__dynamic_cast(unaff_R15,&Instruction::typeinfo,&InstructionWithCode::typeinfo
                                     ,0);
        if (local_100.first.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          if (8 < (ulong)((long)local_100.first.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[2] -
                         (long)local_100.first.pos.
                               super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                               .
                               super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[1])) break;
          this_00 = &local_120->code_seq_end;
          cVar6 = (**(code **)(*local_100.first.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1))
                            (local_100.first.pos.
                             super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                             .
                             super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          local_114 = 0xffffffff;
          if (cVar6 != '\0') {
            local_114 = uVar7;
          }
          std::
          vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
          ::emplace_back<unsigned_int,Hpipe::InstructionWithCode*&>
                    ((vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
                      *)this_00,&local_114,(InstructionWithCode **)&local_100);
          *(undefined1 *)
           (local_100.first.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start + 0x30) = 1;
        }
        if ((long)(unaff_R15->prev).
                  super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(unaff_R15->prev).
                  super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_start != 0x28) break;
        lVar11 = __dynamic_cast(unaff_R15,&Instruction::typeinfo,&InstructionNextChar::typeinfo,0);
        bVar23 = true;
        if ((lVar11 != 0) && (*(char *)(lVar11 + 0x174) == '\0')) {
          local_100.first.pos.
          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_100.first.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffff0000);
          lVar16 = *(long *)(lVar11 + 0xf0);
          uVar12 = (*(long *)(lVar11 + 0xf8) - lVar16 >> 3) * -0x5555555555555555;
          uVar14 = 0;
          do {
            if (uVar14 <= uVar12 && uVar12 - uVar14 != 0) {
              plVar1 = *(long **)(lVar16 + 8 + uVar14 * 0x18);
              for (plVar19 = *(long **)(lVar16 + uVar14 * 0x18); plVar19 != plVar1;
                  plVar19 = plVar19 + 5) {
                if ((pIVar18 != (Instruction *)0x0) && ((Instruction *)*plVar19 == pIVar18)) {
                  *(undefined1 *)
                   ((long)&local_100.first.pos.
                           super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                           .
                           super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar14) = 1;
                }
              }
            }
            bVar23 = uVar14 == 0;
            uVar14 = uVar14 + 1;
          } while (bVar23);
          if (((byte)local_100.first.pos.
                     super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                     .
                     super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0) ||
             (local_100.first.pos.
              super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
              super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
              _M_impl.super__Vector_impl_data._M_start._1_1_ == '\0')) {
            uVar7 = uVar7 + (byte)local_100.first.pos.
                                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                  .
                                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
            bVar23 = true;
          }
          else {
            bVar23 = false;
          }
        }
        if (!bVar23) break;
        pIVar13 = ((unaff_R15->prev).
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_start)->inst;
        uVar8 = Instruction::nb_next_rw(pIVar13);
        pIVar18 = unaff_R15;
      } while (uVar8 < (pIVar13 != local_110) + 1);
    }
    pCVar22 = (local_120->code_seq_end).
              super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
              .
              super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((local_120->code_seq_end).
        super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
        .
        super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
        ._M_impl.super__Vector_impl_data._M_finish != pCVar22) {
      pIVar13 = (Instruction *)0x0;
      pIVar18 = (Instruction *)0x1;
      do {
        iVar10 = (int)pIVar18;
        if (pCVar22[(long)pIVar13].offset != 0) {
          pCVar22 = pCVar22 + (long)pIVar13;
          iVar9 = (*(pCVar22->code->super_Instruction)._vptr_Instruction[0x1b])();
          if (((char)iVar9 != '\0') &&
             ((iVar10 == 1 ||
              ((local_120->code_seq_end).
               super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
               .
               super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar10 - 2].offset < pCVar22->offset)))) {
            iVar9 = (*(pCVar22->code->super_Instruction)._vptr_Instruction[0x1c])
                              (pCVar22->code,&this->inst_pool);
            pCVar22->code = (InstructionWithCode *)CONCAT44(extraout_var,iVar9);
            pCVar22->offset = pCVar22->offset + -1;
          }
        }
        pCVar22 = (local_120->code_seq_end).
                  super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                  .
                  super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        unaff_R15 = (Instruction *)(ulong)(iVar10 + 1);
        bVar23 = pIVar18 < (Instruction *)
                           ((long)(local_120->code_seq_end).
                                  super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                                  .
                                  super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar22 >> 4);
        pIVar13 = pIVar18;
        pIVar18 = unaff_R15;
      } while (bVar23);
    }
    local_114 = 0;
    pIVar13 = local_120->exec;
    do {
      pIVar18 = pIVar13;
      pIVar5 = local_120;
      if ((ulong)(pIVar18 != local_120->exec) + 1 <=
          (ulong)(((long)(pIVar18->prev).
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pIVar18->prev).
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))
      break;
      pVVar17 = (pIVar18->next_rw).
                super_vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                .
                super__Vector_base<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar2 = (pIVar18->next_rw).
               super_vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
               .
               super__Vector_base<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar10 = 0;
      bVar23 = false;
      if (pVVar17 != pVVar2) {
        do {
          for (pTVar20 = (pVVar17->
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>).
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              pTVar20 !=
              (pVVar17->super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>).
              super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
              super__Vector_impl_data._M_finish; pTVar20 = pTVar20 + 1) {
            pIVar13 = pTVar20->inst;
            if (pIVar13 != (Instruction *)0x0) {
              unaff_R15 = pIVar13;
            }
            iVar10 = iVar10 + (uint)(pIVar13 != (Instruction *)0x0);
          }
          pVVar17 = pVVar17 + 1;
        } while (pVVar17 != pVVar2);
        bVar23 = iVar10 == 1;
      }
      iVar10 = 0xc;
      pIVar13 = pIVar18;
      if (bVar23) {
        if (pIVar18 == (Instruction *)0x0) {
          local_100.first.pos.
          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        }
        else {
          local_100.first.pos.
          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)__dynamic_cast(pIVar18,&Instruction::typeinfo,&InstructionWithCode::typeinfo
                                      );
        }
        if (local_100.first.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          iVar10 = 0;
          bVar23 = true;
        }
        else if (*(char *)(local_100.first.pos.
                           super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                           .
                           super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0x30) == '\0') {
          bVar23 = (ulong)((long)local_100.first.pos.
                                 super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 .
                                 super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[2] -
                          (long)local_100.first.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[1]) < 9;
          if (bVar23) {
            cVar6 = (**(code **)(*local_100.first.pos.
                                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                  .
                                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1))
                              (local_100.first.pos.
                               super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                               .
                               super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            local_104 = 0xffffffff;
            if (cVar6 != '\0') {
              local_104 = local_114;
            }
            std::
            vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
            ::emplace_back<unsigned_int,Hpipe::InstructionWithCode*&>
                      ((vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
                        *)&pIVar5->code_seq_beg,&local_104,(InstructionWithCode **)&local_100);
            pbVar21 = (bool *)(local_100.first.pos.
                               super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                               .
                               super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + 0x30);
            iVar10 = 0;
          }
          else {
            pIVar5->offset_ncx = local_114;
            pbVar21 = &pIVar5->need_rw;
            iVar10 = 0xc;
          }
          *pbVar21 = true;
        }
        else {
          iVar10 = 0xc;
          bVar23 = false;
        }
        if (bVar23) {
          if (pIVar18 == (Instruction *)0x0) {
            lVar11 = 0;
          }
          else {
            lVar11 = __dynamic_cast(pIVar18,&Instruction::typeinfo,&InstructionNextChar::typeinfo);
          }
          iVar10 = 0;
          pIVar13 = unaff_R15;
          if (((lVar11 != 0) && (*(char *)(lVar11 + 0x174) == '\0')) &&
             ((*(long **)(lVar11 + 0xf0))[1] != **(long **)(lVar11 + 0xf0))) {
            local_114 = local_114 + 1;
          }
        }
      }
    } while (iVar10 == 0);
    local_78._M_unused._M_object = &local_120;
    local_78._8_8_ = &local_114;
    pcStack_60 = std::
                 _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:992:29)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:992:29)>
               ::_M_manager;
    Instruction::apply_rw(local_120->exec,(function<void_(Hpipe::Instruction_*)> *)&local_78,false);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_120->need_rw == true) {
      Context::without_mark(&local_100,&pIVar18->cx);
      std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=(&local_120->ncx,&local_100);
    }
    else {
      Context::without_mark(&local_100,&(local_120->super_Instruction).cx);
      std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=(&local_120->ncx,&local_100);
    }
    if (local_100.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_100.second.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.second.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
    ::~_Rb_tree(&local_100.first.paths_to_strings._M_t);
    if (local_100.first.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.first.paths_to_mark.
                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_100.first.paths_to_mark.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.first.paths_to_mark.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_100.first.pos.
        super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
        super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.first.pos.
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_100.first.pos.
                            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            .
                            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.first.pos.
                            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            .
                            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pCVar3 = (local_120->code_seq_beg).
             super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
             .
             super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar22 = (local_120->code_seq_beg).
                   super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                   .
                   super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar22 != pCVar3;
        pCVar22 = pCVar22 + 1) {
      (*(pCVar22->code->super_Instruction)._vptr_Instruction[0x1a])
                (pCVar22->code,&(local_120->super_Instruction).running_strs);
      pIVar4 = pCVar22->code;
      if (pIVar4 == (InstructionWithCode *)0x0) {
        lVar11 = 0;
      }
      else {
        lVar11 = __dynamic_cast(pIVar4,&InstructionWithCode::typeinfo,&InstructionBegStr::typeinfo,0
                               );
      }
      if (lVar11 == 0) {
        if (pIVar4 == (InstructionWithCode *)0x0) {
          lVar11 = 0;
        }
        else {
          lVar11 = __dynamic_cast(pIVar4,&InstructionWithCode::typeinfo,&InstructionEndStr::typeinfo
                                  ,0);
        }
        if (lVar11 != 0) {
          Context::rem_string(&(local_120->ncx).first,(string *)(lVar11 + 0x188));
        }
      }
      else {
        Context::add_string(&(local_120->ncx).first,(string *)(lVar11 + 0x188),
                            *(uint *)(lVar11 + 0x174));
      }
    }
    if (local_120->need_rw == false) {
      uVar14 = (long)(local_120->code_seq_end).
                     super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                     .
                     super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_120->code_seq_end).
                     super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                     .
                     super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = uVar14 & 0xffffffff0;
      if (uVar12 != 0) {
        uVar14 = uVar14 >> 4 & 0xffffffff;
        lVar11 = uVar12 - 8;
        do {
          pCVar22 = (local_120->code_seq_end).
                    super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                    .
                    super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          plVar19 = *(long **)((long)&pCVar22->offset + lVar11);
          (**(code **)(*plVar19 + 0xd0))(plVar19,&(local_120->super_Instruction).running_strs);
          lVar16 = *(long *)((long)&pCVar22->offset + lVar11);
          if (lVar16 == 0) {
            lVar15 = 0;
          }
          else {
            lVar15 = __dynamic_cast(lVar16,&InstructionWithCode::typeinfo,
                                    &InstructionBegStr::typeinfo,0);
          }
          if (lVar15 == 0) {
            if (lVar16 == 0) {
              lVar16 = 0;
            }
            else {
              lVar16 = __dynamic_cast(lVar16,&InstructionWithCode::typeinfo,
                                      &InstructionEndStr::typeinfo,0);
            }
            if (lVar16 != 0) {
              Context::rem_string(&(local_120->ncx).first,(string *)(lVar16 + 0x188));
            }
          }
          else {
            Context::add_string(&(local_120->ncx).first,(string *)(lVar15 + 0x188),
                                *(uint *)(lVar15 + 0x174));
          }
          uVar14 = uVar14 - 1;
          lVar11 = lVar11 + -0x10;
        } while (uVar14 != 0);
      }
    }
  }
  return;
}

Assistant:

void InstructionGraph::make_rewind_data( InstructionRewind *rewind ) {
    make_rewind_exec( rewind->mark, rewind );

    if ( ! rewind->exec ) {
        rewind->ncx = rewind->cx.without_mark();
        return;
    }

    // read instructions from the end (from OK instruction) until undecidabitity
    InstructionOK *ok = 0;
    unsigned offset_end = 0;
    rewind->exec->apply_rw( [&]( Instruction *inst ) {
        if ( InstructionOK *tr = dynamic_cast<InstructionOK *>( inst ) )
            ok = tr;
    } );
    if ( ok ) {
        for( Instruction *inst = ok, *next = nullptr; ; ) {
            // if in a loop, stop here
            if ( inst->nb_next_rw() >= 1 + bool( inst != ok ) )
                break;

            // some code to register ?
            if ( InstructionWithCode *wc = dynamic_cast<InstructionWithCode *>( inst ) ) {
                // if ambiguity, on a code, we stop here, to let the beg seq take care of it (with a rewind)
                if ( wc->cx.pos.size() >= 2 )
                    break;
                rewind->code_seq_end.emplace_back( wc->data_code() ? offset_end : -1, wc );
                wc->in_code_seq = true;
            }

            // several choices or end ?
            if ( inst->prev.size() != 1 )
                break;

            // advance
            if ( InstructionNextChar *nc = dynamic_cast<InstructionNextChar *>( inst ) ) {
                if ( nc->beg == false ) {
                    bool in[ 2 ] = { false, false }; // in ok, in ko
                    for( unsigned nt = 0; nt < 2; ++nt ) {
                        if ( nt < nc->next_rw.size() ) {
                            for( const Transition &t : nc->next_rw[ nt ] )
                                if ( next && t.inst == next )
                                    in[ nt ] = true;
                        }
                    }
                    // if OK and KO are possible, we don't know if we have to advance or not
                    if ( in[ 0 ] && in[ 1 ] )
                        break;
                    if ( in[ 0 ] )
                        ++offset_end;
                }
            }

            // loop
            next = inst;
            inst = inst->prev[ 0 ].inst;
        }
    }

    // replace _next instruction to non next versions if possible
    for( unsigned num_item = 0; num_item < rewind->code_seq_end.size(); ++num_item ) {
        InstructionRewind::CodeSeqItem &item = rewind->code_seq_end[ num_item ];
        if ( item.offset && item.code->works_on_next() && ( num_item == 0 || rewind->code_seq_end[ num_item - 1 ].offset < item.offset ) ) {
            item.code = item.code->no_works_on_next_clone( inst_pool );
            --item.offset;
        }
    }

    // read instructions from the beginning, until undecidability
    unsigned offset_beg = 0;
    const Context *ncx_beg = 0;
    for( Instruction *inst = rewind->exec; ; ) {
        ncx_beg = &inst->cx;

        // if in a loop, stop here
        if ( inst->prev.size() >= 1 + bool( inst != rewind->exec ) )
            break;

        // several choices / undecidability or no next
        Instruction *next_rw;
        unsigned nb_next_rw = 0;
        for( const Vec<Transition> &n : inst->next_rw ) {
            for( const Transition &t : n ) {
                if ( t.inst ) {
                    next_rw = t.inst;
                    ++nb_next_rw;
                }
            }
        }
        if ( nb_next_rw != 1 )
            break;

        // some code to register ?
        if ( InstructionWithCode *wc = dynamic_cast<InstructionWithCode *>( inst ) ) {
            // already handled by code_seq_end
            if ( wc->in_code_seq )
                break;
            // if ambiguity, we make a rewind on wc
            if ( wc->cx.pos.size() >= 2 ) {
                rewind->offset_ncx = offset_beg;
                rewind->need_rw = true;
                break;
            }
            // else, register in code_seq_beg
            rewind->code_seq_beg.emplace_back( wc->data_code() ? offset_beg : -1, wc );
            wc->in_code_seq = true;
        }

        // advance
        if ( InstructionNextChar *nc = dynamic_cast<InstructionNextChar *>( inst ) ) {
            if ( nc->beg == false && nc->next_rw[ 0 ].size() )
                ++offset_beg;
        }

        //
        inst = next_rw;
    }

    // test if there are some instructions between code_seq_beg and code_seq_end
    rewind->exec->apply_rw( [&]( Instruction *inst ) {
        if ( InstructionWithCode *code = dynamic_cast<InstructionWithCode *>( inst ) ) {
            if ( ! code->in_code_seq ) {
                rewind->offset_ncx = offset_beg;
                rewind->need_rw = true;
            }
        }
    } );

    // restart context
    if ( rewind->need_rw )
        rewind->ncx = ncx_beg->without_mark();
    else
        rewind->ncx = rewind->cx.without_mark();

    // stuff that may change the restart context
    for( const InstructionRewind::CodeSeqItem &csi : rewind->code_seq_beg ) {
        csi.code->update_running_strings( rewind->running_strs );

        if ( InstructionBegStr *bs = dynamic_cast<InstructionBegStr *>( csi.code ) )
            rewind->ncx.first.add_string( bs->var, bs->num_active_item );
        else if ( InstructionEndStr *es = dynamic_cast<InstructionEndStr *>( csi.code ) )
            rewind->ncx.first.rem_string( es->var );
    }
    if ( ! rewind->need_rw ) {
        for( unsigned i = rewind->code_seq_end.size(); i--; ) {
            const InstructionRewind::CodeSeqItem &csi = rewind->code_seq_end[ i ];
            csi.code->update_running_strings( rewind->running_strs );

            if ( InstructionBegStr *bs = dynamic_cast<InstructionBegStr *>( csi.code ) )
                rewind->ncx.first.add_string( bs->var, bs->num_active_item );
            else if ( InstructionEndStr *es = dynamic_cast<InstructionEndStr *>( csi.code ) )
                rewind->ncx.first.rem_string( es->var );
        }

    }

    //    // add save point, remove mark if possible
    //    for( InstructionMark *mark : marks ) {
    //        // make rewind->exec, update flags for mark
    //        bool remove_mark = true;
    //        unsigned num_save = 0;
    //        for( InstructionRewind *rewind : mark->rewinds ) {
    //            if ( rewind->need_rw )
    //                remove_mark = false;
    //            else if ( rewind->code_seq.size() ) {
    //                // add save points
    //                for( InstructionWithCode *code : rewind->code_seq ) {
    //                    if ( not code->data_code() )
    //                        continue;
    //                    Instruction *orig = code->orig;
    //                    while ( orig->prev.size() == 1 and dynamic_cast<InstructionWithCode *>( orig->prev[ 0 ].inst ) )
    //                        orig = orig->prev[ 0 ].inst;
    //                    if ( orig->prev.size() == 1 and dynamic_cast<InstructionSave *>( orig->prev[ 0 ].inst ) ) {
    //                        code->save = static_cast<InstructionSave *>( orig->prev[ 0 ].inst );
    //                        continue;
    //                    }
    //                    code->save = inst_pool << new InstructionSave( orig->cx, num_save++ );
    //                    orig->insert_before_this( code->save, init );
    //                    // code->save->mark = mark;
    //                }
    //            }
    //        }
}